

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool P_SeekerMissile(AActor *actor,double thresh,double turnMax,bool precise,bool usecurspeed)

{
  bool bVar1;
  undefined7 in_register_00000011;
  AActor *target;
  double dVar2;
  double dVar3;
  double dVar4;
  AActor **ppAVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  DAngle local_38;
  _func_int **local_30;
  
  if ((int)CONCAT71(in_register_00000011,usecurspeed) == 0) {
    dVar2 = actor->Speed;
  }
  else {
    dVar2 = (actor->Vel).X;
    dVar6 = (actor->Vel).Y;
    dVar3 = (actor->Vel).Z;
    dVar2 = c_sqrt(dVar3 * dVar3 + dVar6 * dVar6 + dVar2 * dVar2);
  }
  target = (actor->tracer).field_0.p;
  if ((target != (AActor *)0x0) &&
     (((target->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (actor->tracer).field_0.p = (AActor *)0x0;
    target = (AActor *)0x0;
  }
  if ((target != (AActor *)0x0) && (bVar1 = AActor::CanSeek(actor,target), bVar1)) {
    if (((target->flags).Value & 4) != 0) {
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        return true;
      }
      AActor::AngleTo((AActor *)&stack0xffffffffffffffd0,actor,SUB81(target,0));
      dVar6 = (actor->Angles).Yaw.Degrees;
      dVar8 = (double)SUB84(((double)local_30 - dVar6) * 11930464.711111112 + 6755399441055744.0,0)
              * 8.381903171539307e-08;
      dVar3 = dVar8;
      if (dVar8 <= -dVar8) {
        dVar3 = -dVar8;
      }
      dVar9 = dVar3;
      if ((thresh < dVar3) && (dVar9 = dVar3 * 0.5, turnMax < dVar3 * 0.5)) {
        dVar9 = turnMax;
      }
      dVar3 = 0.0;
      (actor->Angles).Yaw.Degrees =
           dVar6 + (double)(~-(ulong)(dVar8 <= 0.0) & (ulong)dVar9 |
                           (ulong)-dVar9 & -(ulong)(dVar8 <= 0.0));
      if (precise) {
        if (((actor->flags3).Value & 3) == 0) {
          dVar3 = AActor::Distance2D(actor,target,false);
          dVar6 = 1.0;
          if (1.0 <= dVar3) {
            dVar6 = dVar3;
          }
          dVar3 = target->Height;
          bVar1 = DObject::IsKindOf((DObject *)target,APlayerPawn::RegistrationInfo.MyClass);
          if (bVar1) {
            ppAVar5 = target[1].sprev;
          }
          else {
            ppAVar5 = (AActor **)(dVar3 * 0.5);
          }
          dVar3 = c_atan2(((double)ppAVar5 + (target->__Pos).Z) -
                          (actor->Height * 0.5 + (actor->__Pos).Z),dVar6);
          dVar3 = dVar3 * 57.29577951308232;
        }
        local_38.Degrees = -dVar3;
        AActor::Vel3DFromAngle(actor,&local_38,dVar2);
        return true;
      }
      AActor::VelFromAngle(actor,dVar2);
      if (((actor->flags3).Value & 3) != 0) {
        return true;
      }
      dVar6 = (actor->__Pos).Z;
      dVar3 = actor->Height;
      dVar8 = (target->__Pos).Z;
      if ((dVar8 <= dVar6 + dVar3) && (dVar6 <= target->Height + dVar8)) {
        return true;
      }
      dVar9 = target->Height;
      dVar4 = AActor::Distance2D(actor,target,false);
      dVar7 = 1.0;
      if (1.0 <= dVar4 / dVar2) {
        dVar7 = dVar4 / dVar2;
      }
      (actor->Vel).Z = ((dVar8 + dVar9 * 0.5) - (dVar6 + dVar3 * 0.5)) / dVar7;
      return true;
    }
    (actor->tracer).field_0.p = (AActor *)0x0;
  }
  return false;
}

Assistant:

bool P_SeekerMissile (AActor *actor, double thresh, double turnMax, bool precise, bool usecurspeed)
{
	int dir;
	DAngle delta;
	AActor *target;
	double speed;

	speed = !usecurspeed ? actor->Speed : actor->VelToSpeed();
	target = actor->tracer;
	if (target == NULL || !actor->CanSeek(target))
	{
		return false;
	}
	if (!(target->flags & MF_SHOOTABLE))
	{ // Target died
		actor->tracer = NULL;
		return false;
	}
	if (speed == 0)
	{ // Technically, we're not seeking since our speed is 0, but the target *is* seekable.
		return true;
	}
	dir = P_FaceMobj (actor, target, &delta);
	if (delta > thresh)
	{
		delta /= 2;
		if (delta > turnMax)
		{
			delta = turnMax;
		}
	}
	if (dir)
	{ // Turn clockwise
		actor->Angles.Yaw += delta;
	}
	else
	{ // Turn counter clockwise
		actor->Angles.Yaw -= delta;
	}
	
	if (!precise)
	{
		actor->VelFromAngle(speed);

		if (!(actor->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER)))
		{
			if (actor->Top() < target->Z() ||
				target->Top() < actor->Z())
			{ // Need to seek vertically
				actor->Vel.Z = (target->Center() - actor->Center()) / actor->DistanceBySpeed(target, speed);
			}
		}
	}
	else
	{
		DAngle pitch = 0.;
		if (!(actor->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER)))
		{ // Need to seek vertically
			double dist = MAX(1., actor->Distance2D(target));
			// Aim at a player's eyes and at the middle of the actor for everything else.
			double aimheight = target->Height/2;
			if (target->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				aimheight = static_cast<APlayerPawn *>(target)->ViewHeight;
			}
			pitch = DVector2(dist, target->Z() + aimheight - actor->Center()).Angle();
		}
		actor->Vel3DFromAngle(-pitch, speed);
	}

	return true;
}